

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostasyn.c
# Opt level: O3

CURLcode Curl_addrinfo_callback(connectdata *conn,int status,Curl_addrinfo *ai)

{
  Curl_easy *data;
  Curl_dns_entry *pCVar1;
  CURLcode CVar2;
  
  (conn->async).status = status;
  if (status == 0) {
    if (ai != (Curl_addrinfo *)0x0) {
      data = conn->data;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar1 = Curl_cache_addr(data,ai,(conn->async).hostname,(conn->async).port);
      CVar2 = CURLE_OK;
      if (pCVar1 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(ai);
        CVar2 = CURLE_OUT_OF_MEMORY;
      }
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      goto LAB_0012cd5c;
    }
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar2 = CURLE_OK;
  }
  pCVar1 = (Curl_dns_entry *)0x0;
LAB_0012cd5c:
  (conn->async).dns = pCVar1;
  (conn->async).done = true;
  return CVar2;
}

Assistant:

CURLcode Curl_addrinfo_callback(struct connectdata *conn,
                                int status,
                                struct Curl_addrinfo *ai)
{
  struct Curl_dns_entry *dns = NULL;
  CURLcode result = CURLE_OK;

  conn->async.status = status;

  if(CURL_ASYNC_SUCCESS == status) {
    if(ai) {
      struct Curl_easy *data = conn->data;

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      dns = Curl_cache_addr(data, ai,
                            conn->async.hostname,
                            conn->async.port);
      if(!dns) {
        /* failed to store, cleanup and return error */
        Curl_freeaddrinfo(ai);
        result = CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  conn->async.dns = dns;

 /* Set async.done TRUE last in this function since it may be used multi-
    threaded and once this is TRUE the other thread may read fields from the
    async struct */
  conn->async.done = TRUE;

  /* IPv4: The input hostent struct will be freed by ares when we return from
     this function */
  return result;
}